

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Int64Set * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::Int64Set>(Arena *this)

{
  void *ptr;
  Int64Set *pIVar1;
  Arena *local_18;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  ptr = AllocateInternal(this,0x28,8,(_func_void_void_ptr *)0x0,
                         (type_info *)&CoreML::Specification::Int64Set::typeinfo);
  local_18 = this;
  pIVar1 = InternalHelper<CoreML::Specification::Int64Set>::Construct<google::protobuf::Arena*>
                     (ptr,&local_18);
  return pIVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }